

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void crnlib::crn_threading_init(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  g_number_of_processors = 1;
  if (1 < (int)lVar1) {
    g_number_of_processors = (int)lVar1;
  }
  return;
}

Assistant:

void crn_threading_init()
    {
#ifdef WIN32
        SYSTEM_INFO g_system_info;
        GetSystemInfo(&g_system_info);
        g_number_of_processors = math::maximum<uint>(1U, g_system_info.dwNumberOfProcessors);
#else
        g_number_of_processors = math::maximum<int>(1, sysconf(_SC_NPROCESSORS_ONLN));
#endif
    }